

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  float fVar2;
  int iVar3;
  GLuint GVar4;
  GLuint shader;
  GLuint program;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  ostream *poVar8;
  long lVar9;
  int iVar10;
  int *piVar11;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 *m1;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  float fVar17;
  float rotation_1;
  float local_190;
  float local_18c;
  float local_188;
  float local_184;
  float rotation;
  undefined4 uStack_17c;
  undefined4 local_178;
  undefined4 local_170;
  undefined4 local_16c;
  int width;
  float ratio;
  undefined4 local_160;
  undefined4 local_15c;
  GLuint local_158;
  int local_154;
  float local_150;
  int height;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 local_148;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  long local_108;
  GLuint vao;
  GLuint cubemap;
  value_type local_f8 [16];
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 local_b8;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 local_7c;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 local_78;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 local_3c;
  
  iVar3 = glfwInit();
  if (iVar3 == 0) {
    pcVar12 = "Failed to init GLFW";
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cout,"GLFW Successfully Started");
    std::endl<char,std::char_traits<char>>(poVar8);
    glfwSetErrorCallback(glfw_error_callback);
    glfwWindowHint(0x22002,4);
    glfwWindowHint(0x22003,0);
    lVar9 = glfwCreateWindow(0x280,0x1e0,"Stupid SH Tricks",0,0);
    if (lVar9 != 0) {
      iVar3 = 0x110733;
      glfwSetKeyCallback(lVar9);
      glfwMakeContextCurrent(lVar9);
      glewInit();
      glfwSwapInterval(1);
      _check_gl_error((char *)0x1a0,iVar3);
      iVar3 = (int)&vao;
      (*__glewGenVertexArrays)(1);
      (*__glewBindVertexArray)(vao);
      _check_gl_error((char *)0x1a5,iVar3);
      (*__glewGenBuffers)(1,&sphere_buffer);
      GVar4 = sphere_buffer;
      (*__glewBindBuffer)(0x8892);
      regenerateSpherePositions();
      _check_gl_error((char *)0x1aa,GVar4);
      (*__glewGenBuffers)(1,&vertex_buffer);
      GVar4 = vertex_buffer;
      (*__glewBindBuffer)(0x8892);
      regenerateBuffer();
      _check_gl_error((char *)0x1af,GVar4);
      (*__glewGenBuffers)(1,&legendre_buffer);
      GVar4 = legendre_buffer;
      (*__glewBindBuffer)(0x8892);
      regenerateSHBuffer();
      _check_gl_error((char *)0x1b4,GVar4);
      (*__glewGenBuffers)(1,&index_buffer);
      GVar4 = index_buffer;
      (*__glewBindBuffer)(0x8893);
      regenerateIndices();
      _check_gl_error((char *)0x1b9,GVar4);
      glGenTextures(1,&cubemap);
      (*__glewActiveTexture)(0x84c0);
      glBindTexture(0xde1,cubemap);
      loadCubemap("assets/ToTheMoonRocket.jpg");
      GVar4 = (*__glewCreateShader)(0x8b31);
      iVar10 = 1;
      iVar3 = iVar10;
      (*__glewShaderSource)(GVar4,1,&vertex_shader_text,0);
      (*__glewCompileShader)(GVar4);
      _check_gl_error((char *)0x1c3,iVar3);
      checkShaderError(GVar4);
      shader = (*__glewCreateShader)(0x8b30);
      (*__glewShaderSource)(shader,1,&fragment_shader_text,0);
      (*__glewCompileShader)(shader);
      _check_gl_error((char *)0x1c9,iVar10);
      checkShaderError(shader);
      program = (*__glewCreateProgram)();
      (*__glewAttachShader)(program,GVar4);
      (*__glewAttachShader)(program);
      (*__glewLinkProgram)(program);
      (*__glewValidateProgram)(program);
      checkLinkError(program);
      _check_gl_error((char *)0x1d2,shader);
      local_16c = (*__glewGetUniformLocation)(program,"MVP");
      local_170 = (*__glewGetUniformLocation)(program,"scale");
      local_15c = (*__glewGetUniformLocation)(program,"textured");
      uVar5 = (*__glewGetAttribLocation)(program,"vPos");
      iVar3 = 0x155322;
      local_158 = program;
      uVar6 = (*__glewGetAttribLocation)(program);
      _check_gl_error((char *)0x1da,iVar3);
      glClearColor(0x3e4ccccd,0x3e4ccccd,0x3e4ccccd,0x3f800000);
      glEnable(0xb71);
      GVar4 = sphere_buffer;
      (*__glewBindBuffer)(0x8892);
      _check_gl_error((char *)0x1e2,GVar4);
      (*__glewEnableVertexAttribArray)(uVar5);
      _check_gl_error((char *)0x1e4,GVar4);
      iVar3 = 3;
      (*__glewVertexAttribPointer)(uVar5,3,0x1406,0,0xc,0);
      _check_gl_error((char *)0x1e6,iVar3);
      local_160 = uVar6;
      (*__glewEnableVertexAttribArray)(uVar6);
      _check_gl_error((char *)0x1ea,iVar3);
      glfwGetTime();
      local_108 = lVar9;
      while( true ) {
        iVar3 = glfwWindowShouldClose(lVar9);
        if (iVar3 != 0) break;
        local_78.field_0.x = 1.0;
        local_78.field_0.y = 0.0;
        local_78.field_0.z = 0.0;
        local_78.field_0.w = 0.0;
        uStack_68 = 0;
        uStack_64 = 0x3f800000;
        uStack_60 = 0;
        uStack_58 = 0;
        local_50 = 0x3f800000;
        local_4c = 0;
        uStack_48 = 0;
        uStack_44 = 0;
        uStack_40 = 0;
        local_3c = 0x3f800000;
        local_b8.field_0.x = 1.0;
        local_b8.field_0.y = 0.0;
        local_b8.field_0.z = 0.0;
        local_b8.field_0.w = 0.0;
        uStack_a8 = 0;
        uStack_a4 = 0x3f800000;
        uStack_a0 = 0;
        uStack_98 = 0;
        local_90 = 0x3f800000;
        local_8c = 0;
        uStack_88 = 0;
        uStack_84 = 0;
        uStack_80 = 0;
        local_7c = 0x3f800000;
        local_f8[0] = 1.0;
        local_f8[1] = 0.0;
        local_f8[2] = 0.0;
        local_f8[3] = 0.0;
        local_f8[4] = 0.0;
        local_f8[5] = 1.0;
        local_f8[6] = 0.0;
        local_f8[7] = 0.0;
        local_f8[8] = 0.0;
        local_f8[9] = 0.0;
        local_f8[10] = 1.0;
        local_f8[0xb] = 0.0;
        local_f8[0xc] = 0.0;
        local_f8[0xd] = 0.0;
        local_f8[0xe] = 0.0;
        local_f8[0xf] = 1.0;
        piVar11 = &width;
        glfwGetFramebufferSize(lVar9,piVar11,&height);
        _check_gl_error((char *)0x1f8,(int)piVar11);
        iVar3 = height;
        ratio = (float)width / (float)height;
        uVar16 = 0;
        iVar10 = 0;
        glViewport(0,0,width,height);
        _check_gl_error((char *)0x1fc,iVar10);
        glClear(0x4100);
        _check_gl_error((char *)0x1fe,iVar10);
        dVar1 = (double)glfwGetTime();
        local_190 = (float)dVar1;
        uVar13 = (ulong)((long)rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 4 & 0xffffffff;
        fVar17 = local_190;
        while( true ) {
          uVar13 = uVar13 - 1;
          if ((int)(uint)uVar13 < 0) break;
          uVar7 = (uint)uVar13 & 0x7fffffff;
          fVar2 = ((fVar17 - rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar7].startTime) * 180.0) /
                  3.1415927;
          rotation = fVar2;
          if (fVar2 < 360.0) {
            glm::rotate<float>((tmat4x4<float> *)&local_148.field_0,
                               (tmat4x4<float> *)&local_78.field_0,&rotation,
                               &rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar7].axis);
            uStack_60 = CONCAT44(uStack_12c,uStack_130);
            uStack_58 = CONCAT44(uStack_124,local_128);
            local_78.field_0.x = local_148.field_0.x;
            local_78.field_0.y = local_148.field_0.y;
            local_78.field_0.z = local_148.field_0.z;
            local_78.field_0.w = local_148.field_0.w;
            uStack_68 = local_138;
            uStack_64 = uStack_134;
            local_50 = uStack_120;
            local_4c = uStack_11c;
            uStack_48 = local_118;
            uStack_44 = uStack_114;
            uStack_40 = uStack_110;
            local_3c = uStack_10c;
            uVar16 = uVar13 & 0xffffffff;
            fVar17 = local_190;
          }
        }
        uVar13 = (long)iVar3 / 5;
        uVar14 = uVar13 & 0xffffffff;
        if (0 < (int)uVar16) {
          std::vector<Rotation,_std::allocator<Rotation>_>::erase
                    (&rotations,
                     (const_iterator)
                     rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar16);
        }
        if (0 < antiRotationFrames) {
          rotation_1 = ((float)antiRotationFrames * 360.0) / (float)theta_n;
          _rotation = 0xbf80000000000000;
          local_178 = 0.0;
          glm::rotate<float>((tmat4x4<float> *)&local_148.field_0,
                             (tmat4x4<float> *)&local_78.field_0,&rotation_1,
                             (tvec3<float> *)&rotation);
          uStack_60 = CONCAT44(uStack_12c,uStack_130);
          uStack_58 = CONCAT44(uStack_124,local_128);
          local_78.field_0.x = local_148.field_0.x;
          local_78.field_0.y = local_148.field_0.y;
          local_78.field_0.z = local_148.field_0.z;
          local_78.field_0.w = local_148.field_0.w;
          uStack_68 = local_138;
          uStack_64 = uStack_134;
          local_50 = uStack_120;
          local_4c = uStack_11c;
          uStack_48 = local_118;
          uStack_44 = uStack_114;
          uStack_40 = uStack_110;
          local_3c = uStack_10c;
        }
        rotation_1 = -1.0;
        local_184 = 1.0;
        local_188 = 10.0;
        local_18c = -10.0;
        rotation = -ratio;
        glm::ortho<float>((tmat4x4<float> *)&local_148.field_0,&rotation,&ratio,&rotation_1,
                          &local_184,&local_188,&local_18c);
        m1 = &local_b8;
        glm::detail::operator*((tmat4x4<float> *)&m1->field_0,(tmat4x4<float> *)&local_78.field_0);
        iVar3 = (int)m1;
        local_f8[0] = local_148.field_0.x;
        local_f8[5] = (value_type)uStack_134;
        local_f8[10] = (value_type)uStack_120;
        local_f8[0xf] = (value_type)uStack_10c;
        (*__glewUseProgram)(local_158);
        _check_gl_error((char *)0x21a,iVar3);
        (*__glewUniformMatrix4fv)(local_16c,1,0,local_f8);
        (*__glewUniform1f)(0x3f800000,local_170);
        uVar7 = (uint)textured;
        (*__glewUniform1i)(local_15c);
        _check_gl_error((char *)0x21e,uVar7);
        GVar4 = vertex_buffer;
        (*__glewBindBuffer)(0x8892);
        _check_gl_error((char *)0x222,GVar4);
        uVar6 = local_160;
        iVar10 = 1;
        iVar3 = iVar10;
        (*__glewVertexAttribPointer)(local_160,1,0x1406,0,4,0);
        _check_gl_error((char *)0x224,iVar3);
        glDrawElements(4,(int)index_count,0x1405,0);
        rotation = -0.5;
        rotation_1 = 0.5;
        local_184 = -0.5;
        local_188 = 0.5;
        local_18c = 10.0;
        local_150 = -10.0;
        glm::ortho<float>((tmat4x4<float> *)&local_148.field_0,&rotation,&rotation_1,&local_184,
                          &local_188,&local_18c,&local_150);
        glm::detail::operator*
                  ((tmat4x4<float> *)&local_b8.field_0,(tmat4x4<float> *)&local_78.field_0);
        local_f8[0] = local_148.field_0.x;
        local_f8[5] = (value_type)uStack_134;
        local_f8[10] = (value_type)uStack_120;
        local_f8[0xf] = (value_type)uStack_10c;
        (*__glewUniformMatrix4fv)(local_16c,1,0,local_f8);
        _check_gl_error((char *)0x232,iVar10);
        GVar4 = legendre_buffer;
        (*__glewBindBuffer)(0x8892);
        _check_gl_error((char *)0x235,GVar4);
        glClear(0x100);
        iVar3 = (int)uVar13;
        local_154 = iVar3 * 4;
        glViewport(0,local_154,uVar14,uVar13 & 0xffffffff);
        uVar5 = local_170;
        (*__glewUniform1f)(legendre_params[0],local_170);
        (*__glewVertexAttribPointer)(uVar6,1,0x1406,0,4,0);
        iVar10 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x241,iVar10);
        local_190 = (float)(iVar3 * 2);
        glViewport(0,local_190,uVar14);
        (*__glewUniform1f)(legendre_params[1],uVar5);
        (*__glewVertexAttribPointer)(uVar6,1,0x1406,0,4,vertex_count << 2);
        iVar10 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x247,iVar10);
        glViewport(0,uVar13 & 0xffffffff,uVar13 & 0xffffffff);
        (*__glewUniform1f)(legendre_params[2],uVar5);
        (*__glewVertexAttribPointer)(uVar6,1,0x1406,0,4,vertex_count << 3);
        iVar10 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x24d,iVar10);
        glViewport(0,0,uVar13 & 0xffffffff,uVar13 & 0xffffffff);
        (*__glewUniform1f)(legendre_params[3],uVar5);
        (*__glewVertexAttribPointer)(uVar6,1,0x1406,0,4,vertex_count * 0xc);
        iVar10 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x253,iVar10);
        iVar15 = width - iVar3;
        glViewport(iVar15,local_154,uVar13 & 0xffffffff,uVar13 & 0xffffffff);
        (*__glewUniform1f)(legendre_params[4],uVar5);
        (*__glewVertexAttribPointer)(uVar6,1,0x1406,0,4,vertex_count << 4);
        iVar10 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x25f,iVar10);
        glViewport(iVar15,iVar3 * 3,uVar13 & 0xffffffff,uVar13 & 0xffffffff);
        (*__glewUniform1f)(legendre_params[5],uVar5);
        (*__glewVertexAttribPointer)(uVar6,1,0x1406,0,4,vertex_count * 0x14);
        iVar3 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x265,iVar3);
        glViewport(iVar15,local_190,uVar14,uVar13 & 0xffffffff);
        (*__glewUniform1f)(legendre_params[6],uVar5);
        (*__glewVertexAttribPointer)(uVar6,1,0x1406,0,4,vertex_count * 0x18);
        iVar3 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x26b,iVar3);
        glViewport(iVar15,uVar13 & 0xffffffff,uVar13 & 0xffffffff);
        (*__glewUniform1f)(legendre_params[7],uVar5);
        (*__glewVertexAttribPointer)(uVar6,1,0x1406,0,4,vertex_count * 0x1c);
        iVar3 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x271,iVar3);
        glViewport(iVar15,0,uVar13 & 0xffffffff);
        (*__glewUniform1f)(legendre_params[8],uVar5);
        (*__glewVertexAttribPointer)(uVar6,1,0x1406,0,4,vertex_count << 5);
        iVar3 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x277,iVar3);
        lVar9 = local_108;
        glfwSwapBuffers(local_108);
        _check_gl_error((char *)0x27d,iVar3);
        glfwPollEvents();
        _check_gl_error((char *)0x282,iVar3);
        if (0 < rotationFrames) {
          rotateParams();
          rotationFrames = rotationFrames + -1;
        }
        if (0 < antiRotationFrames) {
          antiRotationFrames = antiRotationFrames + -1;
        }
        glfwGetTime();
      }
      return 0;
    }
    pcVar12 = "Failed to create window";
  }
  poVar8 = std::operator<<((ostream *)&std::cout,pcVar12);
  std::endl<char,std::char_traits<char>>(poVar8);
  exit(-1);
}

Assistant:

int main() {
    if (!glfwInit()) {
        cout << "Failed to init GLFW" << endl;
        exit(-1);
    }
    cout << "GLFW Successfully Started" << endl;

    glfwSetErrorCallback(glfw_error_callback);

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);
#ifdef APPLE
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
#endif
    GLFWwindow* window = glfwCreateWindow(640, 480, "Stupid SH Tricks", NULL, NULL);
    if (!window) {
        cout << "Failed to create window" << endl;
        exit(-1);
    }
    glfwSetKeyCallback(window, glfw_key_callback);

    glfwMakeContextCurrent(window);
    glewInit();

    glfwSwapInterval(1);

    GLuint vertex_shader, fragment_shader, program;
    GLuint mvp_location, vpos_location, vscale_location, scale_location, textured_location;
    GLuint cubemap;

    initPerformanceData();

    checkError();

    GLuint vao;
    glGenVertexArrays(1, &vao);
    glBindVertexArray(vao);
    checkError();

    glGenBuffers(1, &sphere_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, sphere_buffer);
    regenerateSpherePositions();
    checkError();

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    regenerateBuffer();
    checkError();

    glGenBuffers(1, &legendre_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, legendre_buffer);
    regenerateSHBuffer();
    checkError();

    glGenBuffers(1, &index_buffer);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, index_buffer);
    regenerateIndices();
    checkError();

    glGenTextures(1, &cubemap);
    glActiveTexture(GL_TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, cubemap);
    loadCubemap("assets/ToTheMoonRocket.jpg");

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);
    checkError();
    checkShaderError(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);
    checkError();
    checkShaderError(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);
    glValidateProgram(program);
    checkLinkError(program);
    checkError();


    mvp_location = glGetUniformLocation(program, "MVP");
    scale_location = glGetUniformLocation(program, "scale");
    textured_location = glGetUniformLocation(program, "textured");
    vpos_location = glGetAttribLocation(program, "vPos");
    vscale_location = glGetAttribLocation(program, "vScale");
    checkError();

    glClearColor(0.2f, 0.2f, 0.2f, 1.0f);

    glEnable(GL_DEPTH_TEST);

    // We'll always use the sphere_buffer for vPos
    glBindBuffer(GL_ARRAY_BUFFER, sphere_buffer);
    checkError();
    glEnableVertexAttribArray(vpos_location);
    checkError();
    glVertexAttribPointer(vpos_location, 3, GL_FLOAT, GL_FALSE, sizeof(vec3), 0);
    checkError();

    // We're going to use an attrib array for vScale, but it will be set up later.
    glEnableVertexAttribArray(vscale_location);
    checkError();

    // make sure performance data is clean going into main loop
    markPerformanceFrame();
    printPerformanceData();
    double lastPerfPrintTime = glfwGetTime();
    while (!glfwWindowShouldClose(window)) {
        float ratio;
        int width, height, viewportSize;
        mat4 m, p, mvp;

        {
            Perf stat("Setup frame and clear buffers");
            glfwGetFramebufferSize(window, &width, &height);
            checkError();
            ratio = width / (float) height;
            viewportSize = height / 5;
            glViewport(0, 0, width, height);
            checkError();
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
            checkError();

            float now = float(glfwGetTime());
            int lastValid = 0;
            for (int c = rotations.size()-1; c >= 0; c--) {
                Rotation &rot = rotations[c];
                float rotation = float((now - rot.startTime) * 180 / M_PI);
                if (rotation < 360) {
                    m = rotate(m, rotation, rot.axis);
                    lastValid = c;
                }
            }
            if (lastValid > 0) {
                rotations.erase(rotations.begin(), rotations.begin() + lastValid);
            }

            if (antiRotationFrames > 0) {
                float rotation = antiRotationFrames * 360.f / theta_n;
                m = rotate(m, rotation, vec3(0,-1,0));
            }
        }

        {
            Perf stat("Setup vertex pointers for first draw");
            p = ortho(-ratio, ratio, -1.f, 1.f, 10.f, -10.f);
            mvp = p * m;

            glUseProgram(program);
            checkError();
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat *) &mvp[0, 0]);
            glUniform1f(scale_location, 1.f);
            glUniform1i(textured_location, textured);
            checkError();

            // draw the base buffer
            glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
            checkError();
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), 0);
            checkError();
        }
        {
            Perf stat("Draw base shape");
            // glDrawArrays(GL_POINTS, 0, vertex_count);
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
        }

        // draw the components
        {
            Perf stat("Setup unforms and vertex arrays for components");
            p = ortho(-0.5f, 0.5f, -0.5f, 0.5f, 10.f, -10.f);
            mvp = p * m;
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat *) &mvp[0, 0]);
            checkError();

            glBindBuffer(GL_ARRAY_BUFFER, legendre_buffer);
            checkError();

            glClear(GL_DEPTH_BUFFER_BIT); // always draw components on top of base shape. Depth test still necessary since triangles are unordered
        }

        {
            Perf stat("Draw left side");
            // left side
            glViewport(0, 4 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[0]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (0 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(0, 2 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[1]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (1 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(0, 1 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[2]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (2 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(0, 0 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[3]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (3 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();
        }

        {
            Perf stat("Draw right side");
            // right side
            int right = width - viewportSize;

            glViewport(right, 4 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[4]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (4 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 3 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[5]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (5 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 2 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[6]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (6 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 1 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[7]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (7 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 0 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[8]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (8 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();
        }

        {
            Perf stat("Swap buffers");
            glfwSwapBuffers(window);
            checkError();
        }
        {
            Perf stat("Poll events");
            glfwPollEvents();
            checkError();
        }

        if (rotationFrames > 0) {
            rotateParams();
            rotationFrames--;
        }
        if (antiRotationFrames > 0) {
            antiRotationFrames--;
        }

        markPerformanceFrame();

        double now = glfwGetTime();
        if (now - lastPerfPrintTime > 10.0) {
            printPerformanceData();
            lastPerfPrintTime = now;
        }
    }

    return 0;
}